

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

bool __thiscall
GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>::Geobucket<4UL>::PopLM(Geobucket<4UL> *this,MM<6UL> *lm)

{
  bool bVar1;
  int iVar2;
  reference this_00;
  MOGrevlex<6UL> *pMVar3;
  vector<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
  *in_RDI;
  MM<6UL> *unaff_retaddr;
  MOGrevlex<6UL> *in_stack_00000008;
  MOGrevlex<6UL> *o;
  size_t j;
  size_t i;
  int cmp;
  MM<6UL> *in_stack_ffffffffffffffb8;
  MOGrevlex<6UL> *in_stack_ffffffffffffffc0;
  size_type local_28;
  size_type local_20;
  vector<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
  *m2;
  
  local_20 = 0xffffffffffffffff;
  m2 = in_RDI;
  local_28 = std::
             vector<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
             ::size(in_RDI);
  this_00 = std::
            vector<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
            ::operator[](in_RDI,0);
  pMVar3 = GetOrder(this_00);
  do {
    local_28 = local_28 - 1;
    std::
    vector<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
    ::operator[](in_RDI,local_28);
    bVar1 = MP<6UL,_GF2::MOGrevlex<6UL>_>::IsEmpty((MP<6UL,_GF2::MOGrevlex<6UL>_> *)0x1c56e6);
    if (!bVar1) {
      if (local_20 != 0xffffffffffffffff) {
        in_stack_ffffffffffffffc0 = pMVar3;
        std::
        vector<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
        ::operator[](in_RDI,local_28);
        LM((MP<6UL,_GF2::MOGrevlex<6UL>_> *)in_stack_ffffffffffffffc0);
        iVar2 = MOGrevlex<6UL>::Compare(in_stack_00000008,unaff_retaddr,(MM<6UL> *)m2);
        if (iVar2 < 1) {
          if (iVar2 == 0) {
            std::
            vector<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
            ::operator[](in_RDI,local_20);
            MP<6UL,_GF2::MOGrevlex<6UL>_>::PopLM((MP<6UL,_GF2::MOGrevlex<6UL>_> *)0x1c577e);
            std::
            vector<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
            ::operator[](in_RDI,local_28);
            MP<6UL,_GF2::MOGrevlex<6UL>_>::PopLM((MP<6UL,_GF2::MOGrevlex<6UL>_> *)0x1c5795);
            local_20 = 0xffffffffffffffff;
            local_28 = std::
                       vector<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
                       ::size(in_RDI);
          }
          goto LAB_001c57b1;
        }
      }
      std::
      vector<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
      ::operator[](in_RDI,local_28);
      LM((MP<6UL,_GF2::MOGrevlex<6UL>_> *)in_stack_ffffffffffffffc0);
      MM<6UL>::operator=((MM<6UL> *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      local_20 = local_28;
    }
LAB_001c57b1:
    if (local_28 == 0) {
      if (local_20 != 0xffffffffffffffff) {
        std::
        vector<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
        ::operator[](in_RDI,local_20);
        MP<6UL,_GF2::MOGrevlex<6UL>_>::PopLM((MP<6UL,_GF2::MOGrevlex<6UL>_> *)0x1c57dc);
      }
      return local_20 != 0xffffffffffffffff;
    }
  } while( true );
}

Assistant:

bool PopLM(MM<_n>& lm)
		{
			int cmp;
			size_t i = SIZE_MAX, j = (size_t)_buckets.size();
			const _O& o = _buckets[0].GetOrder();
			do
			{
				// пропускаем пустые корзины
				if (_buckets[--j].IsEmpty())
					continue;
				// новый старший моном?
				if (i == SIZE_MAX || (cmp = o.Compare(_buckets[j].LM(), lm)) > 0)
					lm = _buckets[i = j].LM();
				// одинаковые мономы?
				else if (cmp == 0) 
				{
					// удаляем мономы из корзин и начинаем все сначала
					_buckets[i].PopLM(), _buckets[j].PopLM();
					i = SIZE_MAX, j = (size_t)_buckets.size();
				}
			}
			while (j != 0);
			// моногочлен ненулевой?
			if (i != SIZE_MAX) _buckets[i].PopLM();
			// признак успеха
			return i != SIZE_MAX;
		}